

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::CalendarAstronomer::getSunLongitude(CalendarAstronomer *this)

{
  UBool UVar1;
  double jDay;
  CalendarAstronomer *this_local;
  
  UVar1 = isINVALID(this->sunLongitude);
  if (UVar1 != '\0') {
    jDay = getJulianDay(this);
    getSunLongitude(this,jDay,&this->sunLongitude,&this->meanAnomalySun);
  }
  return this->sunLongitude;
}

Assistant:

double CalendarAstronomer::getSunLongitude()
{
    // See page 86 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    if (isINVALID(sunLongitude)) {
        getSunLongitude(getJulianDay(), sunLongitude, meanAnomalySun);
    }
    return sunLongitude;
}